

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O3

void __thiscall
ObjTable<QPDFWriter::NewObject>::resize(ObjTable<QPDFWriter::NewObject> *this,size_t a_size)

{
  _Rb_tree_header *p_Var1;
  int *piVar2;
  ulong uVar3;
  pointer pNVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  undefined8 uVar7;
  iterator __position;
  size_t sVar8;
  
  std::vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>::resize
            (&this->super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>,
             a_size);
  if (this->min_sparse < a_size) {
    __position._M_node =
         (this->sparse_elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->sparse_elements)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      do {
        uVar3 = *(ulong *)(__position._M_node + 1);
        if (a_size <= uVar3) break;
        pNVar4 = (this->super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>)
                 .super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        p_Var5 = __position._M_node[1]._M_parent;
        p_Var6 = __position._M_node[1]._M_left;
        uVar7 = *(undefined8 *)(__position._M_node + 2);
        piVar2 = &pNVar4[uVar3].xref.field2;
        *(_Base_ptr *)piVar2 = __position._M_node[1]._M_right;
        *(undefined8 *)(piVar2 + 2) = uVar7;
        pNVar4 = pNVar4 + uVar3;
        *(_Base_ptr *)&pNVar4->xref = p_Var5;
        (pNVar4->xref).field1 = (qpdf_offset_t)p_Var6;
        __position = std::
                     _Rb_tree<unsigned_long,std::pair<unsigned_long_const,QPDFWriter::NewObject>,std::_Select1st<std::pair<unsigned_long_const,QPDFWriter::NewObject>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,QPDFWriter::NewObject>>>
                     ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,QPDFWriter::NewObject>,std::_Select1st<std::pair<unsigned_long_const,QPDFWriter::NewObject>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,QPDFWriter::NewObject>>>
                                         *)&this->sparse_elements,__position);
      } while ((_Rb_tree_header *)__position._M_node != p_Var1);
    }
    if ((_Rb_tree_header *)__position._M_node == p_Var1) {
      sVar8 = 0xffffffffffffffff;
    }
    else {
      sVar8 = *(size_t *)(__position._M_node + 1);
    }
    this->min_sparse = sVar8;
  }
  return;
}

Assistant:

void
    resize(size_t a_size)
    {
        std::vector<T>::resize(a_size);
        if (a_size > min_sparse) {
            auto it = sparse_elements.begin();
            auto end = sparse_elements.end();
            while (it != end && it->first < a_size) {
                std::vector<T>::operator[](it->first) = std::move(it->second);
                it = sparse_elements.erase(it);
            }
            min_sparse = (it == end) ? std::numeric_limits<size_t>::max() : it->first;
        }
    }